

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

string * __thiscall
soul::ExpressionHelpers::resolvePartialNameAsUID_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionHelpers *this,ModuleBase *module,
          IdentifierPath *partialName)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  NameSearch local_d8;
  
  local_d8.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_d8.itemsFound.space;
  local_d8.itemsFound.numActive = 0;
  local_d8.itemsFound.numAllocated = 8;
  puVar1 = local_d8.partiallyQualifiedPath.pathSections.space;
  local_d8.partiallyQualifiedPath.pathSections.numActive = 0;
  local_d8.partiallyQualifiedPath.pathSections.numAllocated = 8;
  local_d8.stopAtFirstScopeWithResults = false;
  local_d8.requiredNumFunctionArgs = -1;
  local_d8.findVariables = true;
  local_d8.findTypes = true;
  local_d8.findFunctions = true;
  local_d8.findNamespaces = true;
  local_d8.findProcessors = true;
  local_d8.findProcessorInstances = false;
  local_d8.findEndpoints = true;
  local_d8.onlyFindLocalVariables = false;
  local_d8.partiallyQualifiedPath.pathSections.items = (Identifier *)puVar1;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&local_d8.partiallyQualifiedPath.pathSections,
             (ArrayWithPreallocation<soul::Identifier,_8UL> *)module);
  local_d8.stopAtFirstScopeWithResults = true;
  local_d8.findProcessors = true;
  local_d8._184_4_ = 0x1010101;
  local_d8.findProcessorInstances = false;
  local_d8.findEndpoints = true;
  AST::Scope::performFullNameSearch((Scope *)(this + 0x28),&local_d8,(Statement *)0x0);
  if ((local_d8.itemsFound.numActive != 0) &&
     (uVar2 = *(uint64_t *)local_d8.itemsFound.items, uVar2 != 0)) {
    auVar3 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::ModuleBase::typeinfo,0);
    if (auVar3._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar3._0_8_,auVar3._8_8_);
      goto LAB_0023fcae;
    }
    auVar3 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::TypeDeclarationBase::typeinfo,0);
    if (auVar3._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar3._0_8_,auVar3._8_8_);
      goto LAB_0023fcae;
    }
    auVar3 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::VariableDeclaration::typeinfo,0);
    if (auVar3._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar3._0_8_,auVar3._8_8_);
      goto LAB_0023fcae;
    }
    auVar3 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::EndpointDeclaration::typeinfo,0);
    if (auVar3._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar3._0_8_,auVar3._8_8_);
      goto LAB_0023fcae;
    }
    auVar3 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::Function::typeinfo,0);
    if (auVar3._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar3._0_8_,auVar3._8_8_);
      goto LAB_0023fcae;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0023fcae:
  local_d8.partiallyQualifiedPath.pathSections.numActive = 0;
  if (8 < local_d8.partiallyQualifiedPath.pathSections.numAllocated) {
    if (local_d8.partiallyQualifiedPath.pathSections.items != (Identifier *)0x0) {
      operator_delete__(local_d8.partiallyQualifiedPath.pathSections.items);
    }
    local_d8.partiallyQualifiedPath.pathSections.numAllocated = 8;
    local_d8.partiallyQualifiedPath.pathSections.items = (Identifier *)puVar1;
  }
  local_d8.itemsFound.numActive = 0;
  if ((8 < local_d8.itemsFound.numAllocated) &&
     (local_d8.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
    operator_delete__(local_d8.itemsFound.items);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string resolvePartialNameAsUID (AST::ModuleBase& module, const IdentifierPath& partialName)
    {
        AST::Scope::NameSearch search;
        search.partiallyQualifiedPath = partialName;
        search.stopAtFirstScopeWithResults = true;
        search.findVariables = true;
        search.findTypes = true;
        search.findFunctions = true;
        search.findNamespaces = true;
        search.findProcessors = true;
        search.findProcessorInstances = false;
        search.findEndpoints = true;

        module.performFullNameSearch (search, nullptr);

        if (search.itemsFound.size() != 0)
        {
            auto item = search.itemsFound.front();

            if (auto mb = cast<AST::ModuleBase> (item))            return makeUID (*mb);
            if (auto t = cast<AST::TypeDeclarationBase> (item))    return makeUID (*t);
            if (auto v = cast<AST::VariableDeclaration> (item))    return makeUID (*v);
            if (auto e = cast<AST::EndpointDeclaration> (item))    return makeUID (*e);
            if (auto f = cast<AST::Function> (item))               return makeUID (*f);
        }

        return {};
    }